

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall
t_dart_generator::print_const_value
          (t_dart_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  long lVar1;
  size_t __n;
  pointer pcVar2;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  char cVar3;
  int iVar4;
  t_const_value *ptVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long *plVar11;
  _Rb_tree_header *p_Var12;
  t_type *type_00;
  t_const_value *type_01;
  long lVar13;
  pointer pptVar14;
  char *pcVar15;
  t_const_value *ptVar16;
  t_dart_generator *ptVar17;
  bool bVar18;
  string val_1;
  t_dart_generator *ptVar19;
  _Alloc_hider in_stack_fffffffffffffe70;
  _Alloc_hider __s2;
  _Alloc_hider _Var20;
  size_t in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  string local_160;
  t_const_value *local_140;
  _Base_ptr local_138;
  _Base_ptr local_130 [2];
  undefined1 local_120 [16];
  _Base_ptr local_110;
  undefined1 local_100 [16];
  _Base_ptr local_f0;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  undefined1 local_c0 [16];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ptVar5 = (t_const_value *)t_type::get_true_type(type);
  t_generator::indent((t_generator *)this,out);
  ptVar17 = this;
  if (defval) {
    cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x28))(ptVar5);
    if (cVar3 != '\0') {
LAB_001b506e:
      pcVar2 = (name->_M_dataplus)._M_p;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + name->_M_string_length);
      name_00._M_string_length = (size_type)in_stack_fffffffffffffe70._M_p;
      name_00._M_dataplus._M_p = (pointer)ptVar17;
      name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      name_00.field_2._8_4_ = in_stack_fffffffffffffe80;
      name_00.field_2._12_4_ = in_stack_fffffffffffffe84;
      render_const_value((string *)&stack0xfffffffffffffe70,this,out,name_00,type,ptVar5);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (in_stack_fffffffffffffe70._M_p == &stack0xfffffffffffffe80) {
        return;
      }
      operator_delete(in_stack_fffffffffffffe70._M_p);
      return;
    }
    cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x50))(ptVar5);
    if (cVar3 == '\0') {
LAB_001b5234:
      cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x58))(ptVar5);
      if ((cVar3 == '\0') &&
         (cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x60))(ptVar5),
         cVar3 == '\0')) {
        cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x80))(ptVar5);
        if (cVar3 == '\0') {
          cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x70))(ptVar5);
          if ((cVar3 == '\0') &&
             (cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x78))(ptVar5),
             cVar3 == '\0')) {
            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x18))(ptVar5);
            std::operator+(pbVar9,"compiler error: no const of type ",pbVar10);
            __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          if (!defval) {
            type_name_abi_cxx11_((string *)&stack0xfffffffffffffe70,this,(t_type *)ptVar5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
              operator_delete(in_stack_fffffffffffffe70._M_p);
            }
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x70))(ptVar5);
          if (cVar3 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(out,"new ",4);
            type_name_abi_cxx11_((string *)&stack0xfffffffffffffe70,ptVar17,(t_type *)ptVar5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,".from([",7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
              operator_delete(in_stack_fffffffffffffe70._M_p);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          }
          ptVar16 = *(t_const_value **)
                     &ptVar5[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
          iVar4 = (ptVar17->super_t_oop_generator).super_t_generator.indent_;
          (ptVar17->super_t_oop_generator).super_t_generator.indent_ = iVar4 + 1;
          pptVar14 = (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (pptVar14 !=
              (value->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            type_01 = value;
            local_140 = ptVar5;
            do {
              pcVar2 = (name->_M_dataplus)._M_p;
              local_110 = (_Base_ptr)local_100;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,pcVar2,pcVar2 + name->_M_string_length);
              name_04._M_string_length = (size_type)in_stack_fffffffffffffe70._M_p;
              name_04._M_dataplus._M_p = (pointer)ptVar17;
              name_04.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
              name_04.field_2._8_4_ = in_stack_fffffffffffffe80;
              name_04.field_2._12_4_ = in_stack_fffffffffffffe84;
              render_const_value((string *)&stack0xfffffffffffffe70,ptVar17,out,name_04,
                                 (t_type *)type_01,ptVar16);
              if (local_110 != (_Base_ptr)local_100) {
                operator_delete(local_110);
              }
              poVar6 = t_generator::indent((t_generator *)ptVar17,out);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
                operator_delete(in_stack_fffffffffffffe70._M_p);
              }
              pptVar14 = pptVar14 + 1;
            } while (pptVar14 !=
                     (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
            iVar4 = (ptVar17->super_t_oop_generator).super_t_generator.indent_ + -1;
            ptVar5 = local_140;
          }
          (ptVar17->super_t_oop_generator).super_t_generator.indent_ = iVar4;
          cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x70))(ptVar5);
          out = t_generator::indent((t_generator *)ptVar17,out);
          if (cVar3 == '\0') {
            pcVar15 = "]);";
            lVar13 = 3;
          }
          else {
            pcVar15 = "];";
            lVar13 = 2;
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar15,lVar13);
        }
        else {
          if (!defval) {
            type_name_abi_cxx11_((string *)&stack0xfffffffffffffe70,ptVar17,(t_type *)ptVar5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
              operator_delete(in_stack_fffffffffffffe70._M_p);
            }
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,(name->_M_dataplus)._M_p,name->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," =",2);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," ","");
          scope_up(ptVar17,out,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          p_Var8 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var12 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var8 != p_Var12) {
            ptVar16 = *(t_const_value **)
                       &ptVar5[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
            ptVar5 = (t_const_value *)
                     ptVar5[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              pcVar2 = (name->_M_dataplus)._M_p;
              local_f0 = (_Base_ptr)local_e0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,pcVar2,pcVar2 + name->_M_string_length);
              name_02._M_string_length = (size_type)in_stack_fffffffffffffe70._M_p;
              name_02._M_dataplus._M_p = (pointer)ptVar17;
              name_02.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
              name_02.field_2._8_4_ = in_stack_fffffffffffffe80;
              name_02.field_2._12_4_ = in_stack_fffffffffffffe84;
              render_const_value((string *)&stack0xfffffffffffffe70,ptVar17,out,name_02,type,ptVar16
                                );
              if (local_f0 != (_Base_ptr)local_e0) {
                operator_delete(local_f0);
              }
              local_130[0] = (_Base_ptr)local_120;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_130,pcVar2,pcVar2 + name->_M_string_length);
              name_03._M_string_length = (size_type)in_stack_fffffffffffffe70._M_p;
              name_03._M_dataplus._M_p = (pointer)ptVar17;
              name_03.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
              name_03.field_2._8_4_ = in_stack_fffffffffffffe80;
              name_03.field_2._12_4_ = in_stack_fffffffffffffe84;
              render_const_value(&local_160,ptVar17,out,name_03,type,ptVar5);
              if (local_130[0] != (_Base_ptr)local_120) {
                operator_delete(local_130[0]);
              }
              poVar6 = t_generator::indent((t_generator *)ptVar17,out);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,local_160._M_dataplus._M_p,local_160._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p);
              }
              if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
                operator_delete(in_stack_fffffffffffffe70._M_p);
              }
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
            } while ((_Rb_tree_header *)p_Var8 != p_Var12);
          }
          std::operator+(&local_50,";",&::endl_abi_cxx11_);
          scope_down(ptVar17,out,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      else {
        type_name_abi_cxx11_((string *)&stack0xfffffffffffffe70,this,(t_type *)ptVar5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = new ",7);
        type_name_abi_cxx11_(&local_160,ptVar17,(t_type *)ptVar5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_160._M_dataplus._M_p,local_160._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()",2);
        ptVar19 = ptVar17;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
          operator_delete(in_stack_fffffffffffffe70._M_p);
        }
        iVar4 = (ptVar17->super_t_oop_generator).super_t_generator.indent_;
        (ptVar17->super_t_oop_generator).super_t_generator.indent_ = iVar4 + 1;
        p_Var7 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var12 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)out;
        if ((_Rb_tree_header *)p_Var7 != p_Var12) {
          do {
            local_138 = p_Var8;
            plVar11 = *(long **)&(ptVar5->identifierVal_).field_2;
            if (plVar11 == *(long **)((long)&(ptVar5->identifierVal_).field_2 + 8)) {
LAB_001b5adc:
              pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x18))(ptVar5);
              std::operator+(&local_160,"type error: ",pbVar10);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_160);
              *plVar11 = (long)(plVar11 + 2);
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              lVar13 = *(long *)(*(long *)(p_Var7 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,lVar13,*(long *)(*(long *)(p_Var7 + 1) + 0x50) + lVar13
                        );
              std::operator+(pbVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&stack0xfffffffffffffe70,&local_90);
              __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ptVar16 = (t_const_value *)0x0;
            ptVar17 = ptVar19;
            do {
              lVar13 = *plVar11;
              type_00 = (t_type *)&stack0xfffffffffffffe80;
              lVar1 = *(long *)(*(long *)(p_Var7 + 1) + 0x48);
              __s2._M_p = (pointer)type_00;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&stack0xfffffffffffffe70,lVar1,
                         *(long *)(*(long *)(p_Var7 + 1) + 0x50) + lVar1);
              __n = *(size_t *)(lVar13 + 0x70);
              _Var20._M_p = __s2._M_p;
              if (__n == in_stack_fffffffffffffe78) {
                if (__n == 0) {
                  bVar18 = true;
                }
                else {
                  iVar4 = bcmp(*(void **)(lVar13 + 0x68),__s2._M_p,__n);
                  bVar18 = iVar4 == 0;
                }
              }
              else {
                bVar18 = false;
              }
              if ((t_type *)__s2._M_p != (t_type *)&stack0xfffffffffffffe80) {
                operator_delete(__s2._M_p);
              }
              if (bVar18) {
                ptVar16 = *(t_const_value **)(*plVar11 + 0x60);
              }
              plVar11 = plVar11 + 1;
            } while (plVar11 != *(long **)((long)&(ptVar5->identifierVal_).field_2 + 8));
            if (ptVar16 == (t_const_value *)0x0) goto LAB_001b5adc;
            pcVar2 = (name->_M_dataplus)._M_p;
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar2,pcVar2 + name->_M_string_length);
            out = (ostream *)local_138;
            name_01._M_string_length = (size_type)_Var20._M_p;
            name_01._M_dataplus._M_p = (pointer)ptVar17;
            name_01.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
            name_01.field_2._8_4_ = in_stack_fffffffffffffe80;
            name_01.field_2._12_4_ = in_stack_fffffffffffffe84;
            ptVar19 = ptVar17;
            render_const_value((string *)&stack0xfffffffffffffe70,ptVar17,(ostream *)local_138,
                               name_01,type_00,ptVar16);
            if (local_d0 != local_c0) {
              operator_delete(local_d0);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
            poVar6 = t_generator::indent((t_generator *)ptVar17,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"..",2);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            lVar13 = *(long *)(*(long *)(p_Var7 + 1) + 0x48);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,lVar13,*(long *)(*(long *)(p_Var7 + 1) + 0x50) + lVar13)
            ;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_160._M_dataplus._M_p,local_160._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,_Var20._M_p,in_stack_fffffffffffffe78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p);
            }
            if ((t_type *)_Var20._M_p != (t_type *)&stack0xfffffffffffffe80) {
              operator_delete(_Var20._M_p);
            }
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
            p_Var8 = local_138;
          } while ((_Rb_tree_header *)p_Var7 != p_Var12);
          iVar4 = (ptVar17->super_t_oop_generator).super_t_generator.indent_ + -1;
        }
        (ptVar17->super_t_oop_generator).super_t_generator.indent_ = iVar4;
        std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
      }
      goto LAB_001b5566;
    }
  }
  else {
    pcVar15 = "public static final ";
    if (in_static) {
      pcVar15 = "public var ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar15 + 7,(ulong)!in_static * 9 + 4);
    cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x28))(ptVar5);
    if (cVar3 != '\0') {
      type_name_abi_cxx11_((string *)&stack0xfffffffffffffe70,this,(t_type *)ptVar5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
      this = ptVar17;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      ptVar17 = this;
      if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
        operator_delete(in_stack_fffffffffffffe70._M_p);
        ptVar17 = this;
      }
      goto LAB_001b506e;
    }
    cVar3 = (**(code **)(*(long *)&(ptVar5->mapVal_)._M_t._M_impl + 0x50))(ptVar5);
    if (cVar3 == '\0') goto LAB_001b5234;
    type_name_abi_cxx11_((string *)&stack0xfffffffffffffe70,this,(t_type *)ptVar5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,in_stack_fffffffffffffe70._M_p,in_stack_fffffffffffffe78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    if (in_stack_fffffffffffffe70._M_p != &stack0xfffffffffffffe80) {
      operator_delete(in_stack_fffffffffffffe70._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
  t_const_value::get_integer(value);
  poVar6 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
  out = std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_001b5566:
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_dart_generator::print_const_value(std::ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value,
                                        bool in_static,
                                        bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "var " : "static final ");
  }
  if (type->is_base_type()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    string v2 = render_const_value(out, name, type, value);
    out << name;
    out << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name;
    out << " = " << value->get_integer() << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << type_name(type) << " " << name << " = new " << type_name(type) << "()";
    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      out << endl;
      indent(out) << ".." << v_iter->first->get_string() << " = " << val;
    }
    indent_down();
    out << ";" << endl;
  } else if (type->is_map()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " =";
    scope_up(out);

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << key << ": " << val << "," << endl;
    }
    scope_down(out, ";" + endl);

    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " = ";
    t_type* etype;
    if (type->is_list()) {
      out << "[" << endl;
      etype = ((t_list*)type)->get_elem_type();
    } else {
      out << "new " << type_name(type) << ".from([" << endl;
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;

    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << val << "," << endl;
    }
    indent_down();

    if (type->is_list()) {
      indent(out) << "];" << endl;
    } else {
      indent(out) << "]);" << endl;
    }

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}